

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QString * __thiscall
QDomElementPrivate::text(QString *__return_storage_ptr__,QDomElementPrivate *this)

{
  QDomElementPrivate *this_00;
  int iVar1;
  QDomNodePrivate **ppQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s(__return_storage_ptr__,L"",0);
  ppQVar2 = &(this->super_QDomNodePrivate).first;
  do {
    this_00 = (QDomElementPrivate *)*ppQVar2;
    if (this_00 == (QDomElementPrivate *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    iVar1 = (*(this_00->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(this_00);
    if (iVar1 - 3U < 2) {
LAB_00111a53:
      local_38.d = (this_00->super_QDomNodePrivate).value.d.d;
      local_38.ptr = (this_00->super_QDomNodePrivate).value.d.ptr;
      local_38.size = (this_00->super_QDomNodePrivate).value.d.size;
      if (local_38.d != (Data *)0x0) {
        LOCK();
        ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
LAB_00111a90:
      QString::append(__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
    else {
      iVar1 = (*(this_00->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(this_00);
      if (iVar1 == 4) goto LAB_00111a53;
      iVar1 = (*(this_00->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(this_00);
      if (iVar1 == 1) {
        text((QString *)&local_38,this_00);
        goto LAB_00111a90;
      }
    }
    ppQVar2 = &(this_00->super_QDomNodePrivate).next;
  } while( true );
}

Assistant:

QString QDomElementPrivate::text()
{
    QString t(u""_s);

    QDomNodePrivate* p = first;
    while (p) {
        if (p->isText() || p->isCDATASection())
            t += p->nodeValue();
        else if (p->isElement())
            t += static_cast<QDomElementPrivate *>(p)->text();
        p = p->next;
    }

    return t;
}